

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O1

int32_t u_terminateUChars_63(UChar *dest,int32_t destCapacity,int32_t length,UErrorCode *pErrorCode)

{
  UErrorCode UVar1;
  UErrorCode UVar2;
  
  if ((pErrorCode != (UErrorCode *)0x0) &&
     (UVar1 = *pErrorCode, -1 < length && UVar1 < U_ILLEGAL_ARGUMENT_ERROR)) {
    if (length < destCapacity) {
      dest[(uint)length] = L'\0';
      UVar2 = U_ZERO_ERROR;
      if (UVar1 != U_STRING_NOT_TERMINATED_WARNING) {
        return length;
      }
    }
    else {
      UVar2 = U_BUFFER_OVERFLOW_ERROR;
      if (length == destCapacity) {
        UVar2 = U_STRING_NOT_TERMINATED_WARNING;
      }
    }
    *pErrorCode = UVar2;
    return length;
  }
  return length;
}

Assistant:

U_CAPI int32_t U_EXPORT2
u_terminateUChars(UChar *dest, int32_t destCapacity, int32_t length, UErrorCode *pErrorCode) {
    __TERMINATE_STRING(dest, destCapacity, length, pErrorCode);
    return length;
}